

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int resolveOrderGroupBy(NameContext *pNC,Select *pSelect,ExprList *pOrderBy,char *zType)

{
  Parse *pParse;
  Expr *pExpr;
  int iVar1;
  int iVar2;
  Expr *p;
  Expr *pE;
  int iVar3;
  long lVar4;
  long lVar5;
  ExprList_item *pEVar6;
  long in_FS_OFFSET;
  int iCol;
  Walker local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iCol = -0x55555556;
  iVar2 = pSelect->pEList->nExpr;
  pParse = pNC->pParse;
  pEVar6 = pOrderBy->a;
  iVar3 = 0;
  do {
    if (pOrderBy->nExpr <= iVar3) {
      iVar2 = sqlite3ResolveOrderGroupBy(pParse,pSelect,pOrderBy,zType);
LAB_0017b431:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return iVar2;
      }
      __stack_chk_fail();
    }
    pExpr = pEVar6->pExpr;
    p = sqlite3ExprSkipCollateAndLikely(pExpr);
    if (p != (Expr *)0x0) {
      if (*zType == 'G') {
LAB_0017b33a:
        iVar1 = sqlite3ExprIsInteger(p,&iCol,(Parse *)0x0);
        if (iVar1 == 0) {
          (pEVar6->u).x.iOrderByCol = 0;
          iVar1 = sqlite3ResolveExprNames(pNC,pExpr);
          if (iVar1 == 0) {
            lVar5 = 8;
            for (lVar4 = 0; lVar4 < pSelect->pEList->nExpr; lVar4 = lVar4 + 1) {
              iVar1 = sqlite3ExprCompare((Parse *)0x0,pExpr,
                                         *(Expr **)((long)pSelect->pEList->a + lVar5 + -8),-1);
              if (iVar1 == 0) {
                if (pSelect->pWin != (Window *)0x0) {
                  local_68.walkerDepth = 0;
                  local_68.eCode = 0;
                  local_68.mWFlags = 0;
                  local_68.pParse = (Parse *)0x0;
                  local_68.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
                  local_68.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
                  local_68.xExprCallback = resolveRemoveWindowsCb;
                  local_68.u.pSelect = pSelect;
                  sqlite3WalkExpr(&local_68,pExpr);
                }
                (pEVar6->u).x.iOrderByCol = (short)lVar4 + 1;
              }
              lVar5 = lVar5 + 0x18;
            }
            goto LAB_0017b366;
          }
        }
        else {
          if (0xffff0000 < iCol - 0x10000U) goto LAB_0017b361;
          resolveOutOfRangeError(pParse,zType,iVar3 + 1,iVar2,p);
        }
        iVar2 = 1;
        goto LAB_0017b431;
      }
      iCol = resolveAsName((Parse *)pSelect->pEList,(ExprList *)p,pE);
      if (iCol < 1) goto LAB_0017b33a;
LAB_0017b361:
      (pEVar6->u).x.iOrderByCol = (u16)iCol;
    }
LAB_0017b366:
    iVar3 = iVar3 + 1;
    pEVar6 = pEVar6 + 1;
  } while( true );
}

Assistant:

static int resolveOrderGroupBy(
  NameContext *pNC,     /* The name context of the SELECT statement */
  Select *pSelect,      /* The SELECT statement holding pOrderBy */
  ExprList *pOrderBy,   /* An ORDER BY or GROUP BY clause to resolve */
  const char *zType     /* Either "ORDER" or "GROUP", as appropriate */
){
  int i, j;                      /* Loop counters */
  int iCol;                      /* Column number */
  struct ExprList_item *pItem;   /* A term of the ORDER BY clause */
  Parse *pParse;                 /* Parsing context */
  int nResult;                   /* Number of terms in the result set */

  assert( pOrderBy!=0 );
  nResult = pSelect->pEList->nExpr;
  pParse = pNC->pParse;
  for(i=0, pItem=pOrderBy->a; i<pOrderBy->nExpr; i++, pItem++){
    Expr *pE = pItem->pExpr;
    Expr *pE2 = sqlite3ExprSkipCollateAndLikely(pE);
    if( NEVER(pE2==0) ) continue;
    if( zType[0]!='G' ){
      iCol = resolveAsName(pParse, pSelect->pEList, pE2);
      if( iCol>0 ){
        /* If an AS-name match is found, mark this ORDER BY column as being
        ** a copy of the iCol-th result-set column.  The subsequent call to
        ** sqlite3ResolveOrderGroupBy() will convert the expression to a
        ** copy of the iCol-th result-set expression. */
        pItem->u.x.iOrderByCol = (u16)iCol;
        continue;
      }
    }
    if( sqlite3ExprIsInteger(pE2, &iCol, 0) ){
      /* The ORDER BY term is an integer constant.  Again, set the column
      ** number so that sqlite3ResolveOrderGroupBy() will convert the
      ** order-by term to a copy of the result-set expression */
      if( iCol<1 || iCol>0xffff ){
        resolveOutOfRangeError(pParse, zType, i+1, nResult, pE2);
        return 1;
      }
      pItem->u.x.iOrderByCol = (u16)iCol;
      continue;
    }

    /* Otherwise, treat the ORDER BY term as an ordinary expression */
    pItem->u.x.iOrderByCol = 0;
    if( sqlite3ResolveExprNames(pNC, pE) ){
      return 1;
    }
    for(j=0; j<pSelect->pEList->nExpr; j++){
      if( sqlite3ExprCompare(0, pE, pSelect->pEList->a[j].pExpr, -1)==0 ){
        /* Since this expression is being changed into a reference
        ** to an identical expression in the result set, remove all Window
        ** objects belonging to the expression from the Select.pWin list. */
        windowRemoveExprFromSelect(pSelect, pE);
        pItem->u.x.iOrderByCol = j+1;
      }
    }
  }
  return sqlite3ResolveOrderGroupBy(pParse, pSelect, pOrderBy, zType);
}